

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

hts_idx_t * hts_idx_load(char *fn,int fmt)

{
  int iVar1;
  char *pcVar2;
  hts_idx_t *phVar3;
  stat stat_main;
  stat stat_idx;
  stat sStack_138;
  stat local_a8;
  
  pcVar2 = hts_idx_getfn(fn,".csi");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = ".tbi";
    if (fmt == 1) {
      pcVar2 = ".bai";
    }
    pcVar2 = hts_idx_getfn(fn,pcVar2);
    if (pcVar2 == (char *)0x0) {
      return (hts_idx_t *)0x0;
    }
  }
  else {
    fmt = 0;
  }
  iVar1 = stat(fn,&sStack_138);
  if (((iVar1 == 0) && (iVar1 = stat(pcVar2,&local_a8), iVar1 == 0)) &&
     (local_a8.st_mtim.tv_sec < sStack_138.st_mtim.tv_sec)) {
    fprintf(_stderr,"Warning: The index file is older than the data file: %s\n",pcVar2);
  }
  phVar3 = hts_idx_load_local(pcVar2,fmt);
  free(pcVar2);
  return phVar3;
}

Assistant:

hts_idx_t *hts_idx_load(const char *fn, int fmt)
{
    char *fnidx;
    hts_idx_t *idx;
    fnidx = hts_idx_getfn(fn, ".csi");
    if (fnidx) fmt = HTS_FMT_CSI;
    else fnidx = hts_idx_getfn(fn, fmt == HTS_FMT_BAI? ".bai" : ".tbi");
    if (fnidx == 0) return 0;

    // Check that the index file is up to date, the main file might have changed
    struct stat stat_idx,stat_main;
    if ( !stat(fn, &stat_main) && !stat(fnidx, &stat_idx) )
    {
        if ( stat_idx.st_mtime < stat_main.st_mtime )
            fprintf(stderr, "Warning: The index file is older than the data file: %s\n", fnidx);
    }
    idx = hts_idx_load_local(fnidx, fmt);
    free(fnidx);
    return idx;
}